

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O3

ssize_t __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::write
          (ManyToOneRingBuffer *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  AtomicBuffer *pAVar2;
  index_t index;
  undefined4 extraout_var;
  SourcedException *this_00;
  char *pcVar4;
  index_t in_R8D;
  size_t sVar5;
  char *pcVar6;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  uint8_t *puVar3;
  
  if (0 < __fd) {
    checkMsgLength(this,in_R8D);
    index = claimCapacity(this,in_R8D + 0xfU & 0xfffffff8);
    puVar3 = (uint8_t *)CONCAT44(extraout_var,index);
    if (index != -2) {
      pAVar2 = this->m_buffer;
      AtomicBuffer::boundsCheck(pAVar2,index,8);
      *(ulong *)(pAVar2->m_buffer + index) = CONCAT44(__fd,-8 - in_R8D);
      pAVar2 = this->m_buffer;
      sVar5 = (size_t)in_R8D;
      AtomicBuffer::boundsCheck(pAVar2,index + 8,sVar5);
      AtomicBuffer::boundsCheck((AtomicBuffer *)__buf,(int)__n,sVar5);
      memcpy(pAVar2->m_buffer + (long)index + 8,
             (void *)((long)(int)__n + *(long *)((long)__buf + 8)),sVar5);
      pAVar2 = this->m_buffer;
      AtomicBuffer::boundsCheck(pAVar2,index,4);
      puVar3 = pAVar2->m_buffer;
      *(index_t *)(puVar3 + index) = in_R8D + 8;
    }
    return CONCAT71((int7)((ulong)puVar3 >> 8),index != -2);
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_b0,__fd);
  std::operator+(&local_50,"Message type id must be greater than zero, msgTypeId=",&local_b0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,
             "void aeron::concurrent::ringbuffer::RecordDescriptor::checkMsgTypeId(std::int32_t)",""
            );
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O3/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/ringbuffer/RecordDescriptor.h"
  ;
  pcVar4 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client";
  do {
    pcVar4 = pcVar4 + 1;
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
  } while (*pcVar4 == *pcVar1);
  pcVar6 = pcVar6 + (*pcVar1 == '/');
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  sVar5 = strlen(pcVar6);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar6,pcVar6 + sVar5);
  util::SourcedException::SourcedException(this_00,&local_50,&local_70,&local_90,0x56);
  *(undefined ***)this_00 = &PTR__SourcedException_00163af8;
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

bool write(
        std::int32_t msgTypeId, concurrent::AtomicBuffer& srcBuffer, util::index_t srcIndex, util::index_t length)
    {
        bool isSuccessful = false;

        RecordDescriptor::checkMsgTypeId(msgTypeId);
        checkMsgLength(length);

        const util::index_t recordLength = length + RecordDescriptor::HEADER_LENGTH;
        const util::index_t requiredCapacity = util::BitUtil::align(recordLength, RecordDescriptor::ALIGNMENT);
        const util::index_t recordIndex = claimCapacity(requiredCapacity);

        if (INSUFFICIENT_CAPACITY != recordIndex)
        {
            m_buffer.putInt64Ordered(recordIndex, RecordDescriptor::makeHeader(-recordLength, msgTypeId));
            m_buffer.putBytes(RecordDescriptor::encodedMsgOffset(recordIndex), srcBuffer, srcIndex, length);
            m_buffer.putInt32Ordered(RecordDescriptor::lengthOffset(recordIndex), recordLength);

            isSuccessful = true;
        }

        return isSuccessful;
    }